

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  size_t sVar2;
  size_t body_size;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t local_48;
  size_t mess_start;
  size_t body_start;
  size_t capacity;
  size_t local_28;
  size_t rec_start;
  ptls_buffer_t *ppStack_18;
  int ret;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  local_28 = sendbuf->off;
  capacity._5_1_ = 0x16;
  capacity._6_1_ = 3;
  capacity._7_1_ = 3;
  ppStack_18 = sendbuf;
  sendbuf_local = (ptls_buffer_t *)tls;
  rec_start._4_4_ = ptls_buffer__do_pushv(sendbuf,(void *)((long)&capacity + 5),3);
  if (rec_start._4_4_ == 0) {
    body_start = 2;
    rec_start._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",2);
    if (rec_start._4_4_ == 0) {
      mess_start = ppStack_18->off;
      local_48 = ppStack_18->off;
      capacity_1._7_1_ = 0x14;
      rec_start._4_4_ = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&capacity_1 + 7),1);
      if (rec_start._4_4_ == 0) {
        body_start_1 = 3;
        rec_start._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",3);
        if (rec_start._4_4_ == 0) {
          sVar1 = ppStack_18->off;
          rec_start._4_4_ =
               ptls_buffer_reserve(ppStack_18,
                                   *(size_t *)(*(long *)(sendbuf_local[2].off + 0x50) + 8));
          if ((rec_start._4_4_ == 0) &&
             (rec_start._4_4_ =
                   calc_verify_data(ppStack_18->base + ppStack_18->off,
                                    (st_ptls_key_schedule_t *)sendbuf_local[2].off,
                                    &sendbuf_local[5].capacity), rec_start._4_4_ == 0)) {
            ppStack_18->off =
                 *(long *)(*(long *)(sendbuf_local[2].off + 0x50) + 8) + ppStack_18->off;
            sVar2 = ppStack_18->off;
            for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
              ppStack_18->base[sVar1 - body_start_1] =
                   (uint8_t)(sVar2 - sVar1 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
            }
            if (sendbuf_local[2].off != 0) {
              key_schedule_update_hash
                        ((st_ptls_key_schedule_t *)sendbuf_local[2].off,ppStack_18->base + local_48,
                         ppStack_18->off - local_48);
            }
            sVar1 = ppStack_18->off;
            for (; body_start != 0; body_start = body_start - 1) {
              ppStack_18->base[mess_start - body_start] =
                   (uint8_t)(sVar1 - mess_start >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
            if (sendbuf_local != (ptls_buffer_t *)0xffffffffffffff58) {
              rec_start._4_4_ =
                   buffer_encrypt_record
                             (ppStack_18,local_28,
                              (st_ptls_traffic_protection_t *)&sendbuf_local[5].capacity);
            }
          }
        }
      }
    }
  }
  return rec_start._4_4_;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_push_handshake(sendbuf, tls->key_schedule, &tls->traffic_protection.enc, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}